

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O1

string * __thiscall
duckdb::CastExceptionText<duckdb::timestamp_t,duckdb::dtime_t>
          (string *__return_storage_ptr__,duckdb *this,timestamp_t input)

{
  undefined8 *puVar1;
  size_type *psVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  ulong *local_e0;
  long local_d8;
  ulong local_d0;
  long lStack_c8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  string local_a0;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  TypeIdToString_abi_cxx11_(&local_40,(duckdb *)0x9,(PhysicalType)input.value);
  plVar3 = (long *)::std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x1ddff4a);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_50 = *plVar5;
    lStack_48 = plVar3[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar5;
    local_60 = (long *)*plVar3;
  }
  local_58 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_60);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_d0 = *puVar6;
    lStack_c8 = plVar3[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *puVar6;
    local_e0 = (ulong *)*plVar3;
  }
  local_d8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  ConvertToString::Operation<duckdb::timestamp_t>(&local_80,(timestamp_t)this);
  uVar7 = 0xf;
  if (local_e0 != &local_d0) {
    uVar7 = local_d0;
  }
  if (uVar7 < local_80._M_string_length + local_d8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      uVar8 = local_80.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_80._M_string_length + local_d8) goto LAB_016bfe6e;
    puVar4 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_e0);
  }
  else {
LAB_016bfe6e:
    puVar4 = (undefined8 *)
             ::std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_80._M_dataplus._M_p);
  }
  local_100 = &local_f0;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_f0 = *puVar1;
    uStack_e8 = puVar4[3];
  }
  else {
    local_f0 = *puVar1;
    local_100 = (undefined8 *)*puVar4;
  }
  local_f8 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_100);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_b0 = *puVar6;
    lStack_a8 = plVar3[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *puVar6;
    local_c0 = (ulong *)*plVar3;
  }
  local_b8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  TypeIdToString_abi_cxx11_(&local_a0,(duckdb *)0x9,(PhysicalType)local_b8);
  uVar7 = 0xf;
  if (local_c0 != &local_b0) {
    uVar7 = local_b0;
  }
  if (uVar7 < local_a0._M_string_length + local_b8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      uVar8 = local_a0.field_2._M_allocated_capacity;
    }
    if (local_a0._M_string_length + local_b8 <= (ulong)uVar8) {
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0);
      goto LAB_016bffa0;
    }
  }
  puVar4 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0._M_dataplus._M_p);
LAB_016bffa0:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar2) {
    uVar8 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar2;
  puVar4[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}